

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_cursor.c
# Opt level: O0

int pos_form_cursor(FORM *form)

{
  int *piVar1;
  int local_14;
  int res;
  FORM *form_local;
  
  if (form == (FORM *)0x0) {
    local_14 = -2;
  }
  else if ((form->status & 1) == 0) {
    local_14 = -7;
  }
  else {
    local_14 = _nc_Position_Form_Cursor(form);
  }
  piVar1 = __errno_location();
  *piVar1 = local_14;
  return local_14;
}

Assistant:

int pos_form_cursor(FORM * form)
{
  int res;

  if (!form)
   res = E_BAD_ARGUMENT;
  else
    {
      if (!(form->status & _POSTED))
        res = E_NOT_POSTED;
      else
	res = _nc_Position_Form_Cursor(form);
    }
  RETURN(res);
}